

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_SETP(Context *ctx)

{
  char *pcVar1;
  size_t in_RCX;
  char src1 [64];
  char src0 [64];
  char code [128];
  
  make_METAL_srcarg_string_masked(ctx,0,src0,in_RCX);
  make_METAL_srcarg_string_masked(ctx,1,src1,in_RCX);
  pcVar1 = get_METAL_comparison_string_scalar(ctx);
  make_METAL_destarg_assign(ctx,code,0x80,"(%s %s %s)",src0,pcVar1,src1);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_METAL_SETP(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // destination is always predicate register (which is type bvec4).
    const char *comp = (vecsize == 1) ?
            get_METAL_comparison_string_scalar(ctx) :
            get_METAL_comparison_string_vector(ctx);

    make_METAL_destarg_assign(ctx, code, sizeof (code),
                              "(%s %s %s)", src0, comp, src1);
    output_line(ctx, "%s", code);
}